

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefParamSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::DefParamSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  SourceLocation SVar1;
  DefParamSymbol *pDVar2;
  
  pDVar2 = (DefParamSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefParamSymbol *)this->endPtr < pDVar2 + 1) {
    pDVar2 = (DefParamSymbol *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pDVar2 + 1);
  }
  SVar1 = *args;
  (pDVar2->super_Symbol).kind = DefParam;
  (pDVar2->super_Symbol).name._M_len = 0;
  (pDVar2->super_Symbol).name._M_str = "";
  (pDVar2->super_Symbol).location = SVar1;
  (pDVar2->super_Symbol).parentScope = (Scope *)0x0;
  (pDVar2->super_Symbol).nextInScope = (Symbol *)0x0;
  (pDVar2->super_Symbol).indexInScope = 0;
  (pDVar2->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pDVar2->initializer = (Expression *)0x0;
  pDVar2->target = (Symbol *)0x0;
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }